

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O0

void __thiscall
crnlib::dxt1_endpoint_optimizer::optimize_endpoint_comps(dxt1_endpoint_optimizer *this)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  bool bVar4;
  uint16 h;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  byte *pbVar8;
  dxt1_solution_coordinates *coords;
  uchar *puVar9;
  long in_RDI;
  uint64 e;
  uint8 c1;
  uint16 packed_low;
  uint64 e0;
  uint8 c0;
  uint comp_limit;
  uint64 best_error;
  color_quad_u8 high;
  color_quad_u8 low;
  uint8 p1;
  uint8 p0;
  uint comp_index;
  uint64 best_remaining_error [4];
  uint64 error [4] [256];
  color_quad_u8 source_high;
  color_quad_u8 source_low;
  dxt1_endpoint_optimizer *in_stack_ffffffffffffdf50;
  ushort uVar10;
  uint in_stack_ffffffffffffdf58;
  uint in_stack_ffffffffffffdf5c;
  uint in_stack_ffffffffffffdf60;
  undefined4 in_stack_ffffffffffffdf64;
  long in_stack_ffffffffffffdf78;
  dxt1_solution_coordinates local_2074;
  dxt1_solution_coordinates *local_2070;
  byte local_2063;
  uint16 local_2062;
  long local_2060;
  byte local_2055;
  dxt1_endpoint_optimizer *in_stack_ffffffffffffdfb8;
  uint local_203c;
  dxt1_solution_coordinates *local_2038;
  long local_2030;
  long local_2028;
  long local_2020;
  long local_2018 [4];
  uint64 (*in_stack_ffffffffffffe008) [4];
  uint64 (*in_stack_ffffffffffffe010) [4] [256];
  uint in_stack_ffffffffffffe01c;
  dxt1_endpoint_optimizer *in_stack_ffffffffffffe020;
  long alStack_1818 [256];
  long alStack_1018 [256];
  long alStack_818 [257];
  color_quad<unsigned_char,_int> local_10;
  color_quad<unsigned_char,_int> local_c [3];
  
  compute_selectors(in_stack_ffffffffffffdf50);
  if (((*(byte *)(in_RDI + 0x978) & 1) == 0) && (*(long *)(in_RDI + 0x970) != 0)) {
    dxt1_block::unpack_color
              ((uint16)((ulong)in_stack_ffffffffffffdf78 >> 0x30),
               SUB81((ulong)in_stack_ffffffffffffdf78 >> 0x28,0),(uint)in_stack_ffffffffffffdf78);
    dxt1_block::unpack_color
              ((uint16)((ulong)in_stack_ffffffffffffdf78 >> 0x30),
               SUB81((ulong)in_stack_ffffffffffffdf78 >> 0x28,0),(uint)in_stack_ffffffffffffdf78);
    for (local_203c = 0; local_203c < 3; local_203c = local_203c + 1) {
      pbVar8 = color_quad<unsigned_char,_int>::operator[](local_c,local_203c);
      bVar1 = *pbVar8;
      pbVar8 = color_quad<unsigned_char,_int>::operator[](&local_10,local_203c);
      bVar2 = *pbVar8;
      dxt1_block::unpack_color
                ((uint16)((ulong)in_stack_ffffffffffffdf78 >> 0x30),
                 SUB81((ulong)in_stack_ffffffffffffdf78 >> 0x28,0),(uint)in_stack_ffffffffffffdf78);
      dxt1_block::unpack_color
                ((uint16)((ulong)in_stack_ffffffffffffdf78 >> 0x30),
                 SUB81((ulong)in_stack_ffffffffffffdf78 >> 0x28,0),(uint)in_stack_ffffffffffffdf78);
      compute_endpoint_component_errors
                (in_stack_ffffffffffffe020,in_stack_ffffffffffffe01c,in_stack_ffffffffffffe010,
                 in_stack_ffffffffffffe008);
      pbVar8 = color_quad<unsigned_char,_int>::operator[]
                         ((color_quad<unsigned_char,_int> *)&stack0xffffffffffffdfbc,local_203c);
      lVar3 = local_2018[*pbVar8];
      pbVar8 = color_quad<unsigned_char,_int>::operator[]
                         ((color_quad<unsigned_char,_int> *)&stack0xffffffffffffdfb8,local_203c);
      in_stack_ffffffffffffdf78 =
           lVar3 + alStack_1818[*pbVar8] + alStack_1018[(int)(((uint)bVar1 * 2 + (uint)bVar2) / 3)];
      coords = (dxt1_solution_coordinates *)
               (in_stack_ffffffffffffdf78 + alStack_818[(int)(((uint)bVar1 + (uint)bVar2 * 2) / 3)])
      ;
      if (local_2038 < coords) {
        uVar5 = 0x20;
        if (local_203c == 1) {
          uVar5 = 0x40;
        }
        for (local_2055 = 0; local_2055 < uVar5; local_2055 = local_2055 + 1) {
          local_2060 = local_2018[local_2055];
          if ((dxt1_solution_coordinates *)(local_2060 + local_2030) < coords) {
            in_stack_ffffffffffffdf64 = CONCAT13(local_2055,(int3)in_stack_ffffffffffffdf64);
            puVar9 = color_quad<unsigned_char,_int>::operator[]
                               ((color_quad<unsigned_char,_int> *)&stack0xffffffffffffdfbc,
                                local_203c);
            *puVar9 = (uchar)((uint)in_stack_ffffffffffffdf64 >> 0x18);
            local_2062 = dxt1_block::pack_color
                                   ((color_quad_u8 *)
                                    CONCAT44(in_stack_ffffffffffffdf64,in_stack_ffffffffffffdf60),
                                    SUB41(in_stack_ffffffffffffdf5c >> 0x18,0),
                                    in_stack_ffffffffffffdf58);
            if (local_203c == 1) {
              uVar6 = (uint)local_2055 << 2 | (int)(uint)local_2055 >> 4;
            }
            else {
              uVar6 = (uint)local_2055 << 3 | (int)(uint)local_2055 >> 2;
            }
            in_stack_ffffffffffffdf60 = uVar6;
            for (local_2063 = 0; local_2063 < uVar5; local_2063 = local_2063 + 1) {
              local_2070 = (dxt1_solution_coordinates *)(local_2060 + alStack_1818[local_2063]);
              if ((dxt1_solution_coordinates *)((long)&local_2070->m_low_color + local_2028) <
                  coords) {
                if (local_203c == 1) {
                  uVar7 = (uint)local_2063 << 2 | (int)(uint)local_2063 >> 4;
                }
                else {
                  uVar7 = (uint)local_2063 << 3 | (int)(uint)local_2063 >> 2;
                }
                local_2070 = (dxt1_solution_coordinates *)
                             ((long)&local_2070->m_low_color +
                             alStack_1018[(int)(((uVar6 & 0xff) * 2 + (uVar7 & 0xff)) / 3)]);
                in_stack_ffffffffffffdf5c = uVar7;
                if (((dxt1_solution_coordinates *)((long)&local_2070->m_low_color + local_2020) <
                     coords) &&
                   (local_2070 = (dxt1_solution_coordinates *)
                                 ((long)&local_2070->m_low_color +
                                 alStack_818[(int)(((uVar6 & 0xff) + (uVar7 & 0xff) * 2) / 3)]),
                   local_2070 < coords)) {
                  uVar10 = (ushort)local_2063;
                  puVar9 = color_quad<unsigned_char,_int>::operator[]
                                     ((color_quad<unsigned_char,_int> *)&stack0xffffffffffffdfb8,
                                      local_203c);
                  *puVar9 = (uchar)(uVar10 >> 8);
                  in_stack_ffffffffffffdf58 = CONCAT22(local_2062,uVar10);
                  h = dxt1_block::pack_color
                                ((color_quad_u8 *)
                                 CONCAT44(in_stack_ffffffffffffdf64,in_stack_ffffffffffffdf60),
                                 SUB41(in_stack_ffffffffffffdf5c >> 0x18,0),
                                 in_stack_ffffffffffffdf58);
                  dxt1_solution_coordinates::dxt1_solution_coordinates
                            (&local_2074,(uint16)(in_stack_ffffffffffffdf58 >> 0x10),h);
                  bVar4 = evaluate_solution(in_stack_ffffffffffffdfb8,coords,SUB41(uVar5 >> 0x18,0))
                  ;
                  if (((bVar4 ^ 0xffU) & 1) == 0) {
                    if (*(long *)(in_RDI + 0x970) == 0) {
                      return;
                    }
                    compute_selectors(in_stack_ffffffffffffdf50);
                    compute_endpoint_component_errors
                              (in_stack_ffffffffffffe020,in_stack_ffffffffffffe01c,
                               in_stack_ffffffffffffe010,in_stack_ffffffffffffe008);
                    in_stack_ffffffffffffdf50 =
                         (dxt1_endpoint_optimizer *)
                         (local_2018[local_2055] + alStack_1818[local_2063] +
                         alStack_1018[(int)(((uVar6 & 0xff) * 2 + (uVar7 & 0xff)) / 3)]);
                    coords = (dxt1_solution_coordinates *)
                             ((long)in_stack_ffffffffffffdf50->m_rDist +
                             alStack_818[(int)(((uVar6 & 0xff) + (uVar7 & 0xff) * 2) / 3)] + -0x68);
                    local_2060 = local_2018[local_2055];
                    if (coords <= (dxt1_solution_coordinates *)(local_2060 + local_2030)) break;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void dxt1_endpoint_optimizer::optimize_endpoint_comps() {
  compute_selectors();
  if (m_best_solution.m_alpha_block || !m_best_solution.m_error)
    return;
  color_quad_u8 source_low(dxt1_block::unpack_color(m_best_solution.m_coords.m_low_color, true));
  color_quad_u8 source_high(dxt1_block::unpack_color(m_best_solution.m_coords.m_high_color, true));
  uint64 error[4][256], best_remaining_error[4];
  for (uint comp_index = 0; comp_index < 3; comp_index++) {
    uint8 p0 = source_low[comp_index];
    uint8 p1 = source_high[comp_index];
    color_quad_u8 low(dxt1_block::unpack_color(m_best_solution.m_coords.m_low_color, false));
    color_quad_u8 high(dxt1_block::unpack_color(m_best_solution.m_coords.m_high_color, false));
    compute_endpoint_component_errors(comp_index, error, best_remaining_error);
    uint64 best_error = error[0][low[comp_index]] + error[1][high[comp_index]] + error[2][(p0 * 2 + p1) / 3] + error[3][(p0 + p1 * 2) / 3];
    if (best_remaining_error[0] >= best_error)
      continue;
    const uint comp_limit = comp_index == 1 ? 64 : 32;
    for (uint8 c0 = 0; c0 < comp_limit; c0++) {
      uint64 e0 = error[0][c0];
      if (e0 + best_remaining_error[1] >= best_error)
        continue;
      low[comp_index] = c0;
      uint16 packed_low = dxt1_block::pack_color(low, false);
      p0 = comp_index == 1 ? c0 << 2 | c0 >> 4 : c0 << 3 | c0 >> 2;
      for (uint8 c1 = 0; c1 < comp_limit; c1++) {
        uint64 e = e0 + error[1][c1];
        if (e + best_remaining_error[2] >= best_error)
          continue;
        p1 = comp_index == 1 ? c1 << 2 | c1 >> 4 : c1 << 3 | c1 >> 2;
        e += error[2][(p0 * 2 + p1) / 3];
        if (e + best_remaining_error[3] >= best_error)
          continue;
        e += error[3][(p0 + p1 * 2) / 3];
        if (e >= best_error)
          continue;
        high[comp_index] = c1;
        if (!evaluate_solution(dxt1_solution_coordinates(packed_low, dxt1_block::pack_color(high, false))))
          continue;
        if (!m_best_solution.m_error)
          return;
        compute_selectors();
        compute_endpoint_component_errors(comp_index, error, best_remaining_error);
        best_error = error[0][c0] + error[1][c1] + error[2][(p0 * 2 + p1) / 3] + error[3][(p0 + p1 * 2) / 3];
        e0 = error[0][c0];
        if (e0 + best_remaining_error[1] >= best_error)
          break;
      }
    }
  }
}